

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall tetgenio::load_vtk(tetgenio *this,char *filebasename)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  size_t sVar4;
  FILE *pFVar5;
  tetgenio *ptVar6;
  double *pdVar7;
  tetgenio *ptVar8;
  facet *pfVar9;
  long lVar10;
  polygon *ppVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  tetgenio *local_e68;
  long local_e60;
  int line_count;
  int nverts;
  tetgenio *local_e50;
  FILE *local_e48;
  int nfaces;
  long local_e38;
  int local_e2c;
  int local_e28;
  int local_e24;
  int local_e20;
  float _z;
  float _y;
  float _x;
  uchar *local_e10;
  uchar *local_e08;
  int dummy;
  char fmt [64];
  char mode [128];
  char id [256];
  char infilename [1024];
  char line [2048];
  
  nverts = 0;
  nfaces = 0;
  line_count = 0;
  local_e2c = -1;
  strncpy(infilename,filebasename,0x3ff);
  infilename[0x3ff] = '\0';
  if (infilename[0] != '\0') {
    sVar4 = strlen(infilename);
    iVar3 = strcmp(id + sVar4 + 0xfc,".vtk");
    if (iVar3 != 0) {
      sVar4 = strlen(infilename);
      builtin_strncpy(infilename + sVar4,".vtk",5);
    }
    pFVar5 = fopen(infilename,"r");
    if (pFVar5 == (FILE *)0x0) {
      printf("Error:  Unable to open file %s\n",infilename);
      return false;
    }
    pcVar16 = "Opening %s.\n";
    printf("Opening %s.\n",infilename);
    this->firstnumber = 0;
    builtin_strncpy(mode,"BINARY",7);
    uVar15 = 0;
    local_e50 = this;
    local_e48 = pFVar5;
LAB_001110af:
    while( true ) {
      do {
        ptVar6 = (tetgenio *)readline((tetgenio *)pcVar16,line,(FILE *)pFVar5,&line_count);
        if (ptVar6 == (tetgenio *)0x0) {
          return true;
        }
      } while (((ulong)(byte)line[0] < 0x24) &&
              ((0x900002401U >> ((ulong)(byte)line[0] & 0x3f) & 1) != 0));
      __isoc99_sscanf(line,"%s",id);
      iVar3 = bcmp(id,"ASCII",6);
      if (iVar3 == 0) {
        builtin_strncpy(mode,"ASCII",6);
      }
      iVar3 = bcmp(id,"POINTS",7);
      if (iVar3 != 0) break;
      local_e68 = ptVar6;
      __isoc99_sscanf(line,"%s %d %s",id,&nverts,fmt);
      ptVar6 = local_e50;
      iVar3 = nverts;
      uVar14 = (ulong)(uint)nverts;
      if (0 < nverts) {
        local_e50->numberofpoints = nverts;
        pdVar7 = (double *)operator_new__(uVar14 * 0x18);
        ptVar6->pointlist = pdVar7;
        uVar15 = iVar3 + 1;
      }
      ptVar6 = (tetgenio *)mode;
      pcVar16 = (char *)ptVar6;
      iVar3 = bcmp(ptVar6,"BINARY",7);
      pFVar5 = local_e48;
      if (iVar3 == 0) {
        lVar17 = 0x10;
        lVar10 = 0;
        while (lVar10 < (int)uVar14) {
          pdVar7 = local_e50->pointlist;
          local_e60 = lVar17;
          local_e38 = lVar10;
          iVar3 = bcmp(fmt,"double",7);
          if (iVar3 == 0) {
            local_e10 = (uchar *)((long)pdVar7 + local_e60 + -0x10);
            fread(local_e10,8,1,pFVar5);
            local_e08 = (uchar *)((long)pdVar7 + local_e60 + -8);
            pcVar16 = (char *)((long)pdVar7 + local_e60);
            fread(local_e08,8,1,pFVar5);
            fread(pcVar16,8,1,pFVar5);
            swapBytes(local_e10,8);
            swapBytes(local_e08,8);
            swapBytes((uchar *)pcVar16,8);
          }
          else {
            iVar3 = bcmp(fmt,"float",6);
            if (iVar3 != 0) {
              pcVar16 = "Error: Only float or double formats are supported!";
              goto LAB_0011146c;
            }
            fread(&_x,4,1,pFVar5);
            fread(&_y,4,1,pFVar5);
            fread(&_z,4,1,pFVar5);
            swapBytes((uchar *)&_x,4);
            swapBytes((uchar *)&_y,4);
            pcVar16 = (char *)&_z;
            swapBytes((uchar *)pcVar16,4);
            auVar1._8_4_ = SUB84((double)_y,0);
            auVar1._0_8_ = (double)_x;
            auVar1._12_4_ = (int)((ulong)(double)_y >> 0x20);
            *(undefined1 (*) [16])((long)pdVar7 + local_e60 + -0x10) = auVar1;
            *(double *)((long)pdVar7 + local_e60) = (double)_z;
          }
          uVar14 = (ulong)(uint)nverts;
          lVar17 = local_e60 + 0x18;
          lVar10 = local_e38 + 1;
        }
      }
      else {
        iVar3 = bcmp(ptVar6,"ASCII",6);
        pFVar5 = local_e48;
        pcVar16 = (char *)ptVar6;
        if (iVar3 == 0) {
          lVar10 = 0;
          lVar17 = 0;
          while (pcVar16 = (char *)ptVar6, lVar17 < (int)uVar14) {
            ptVar8 = (tetgenio *)readline(ptVar6,line,(FILE *)pFVar5,&line_count);
            if (ptVar8 == (tetgenio *)0x0) {
              pcVar16 = "Unexpected end of file on line %d in file %s\n";
              local_e68 = ptVar8;
LAB_0011181e:
              printf(pcVar16,(ulong)(uint)line_count,infilename);
              fclose(pFVar5);
              return false;
            }
            pdVar7 = local_e50->pointlist;
            local_e60 = lVar10;
            local_e38 = lVar17;
            for (lVar13 = 0; local_e68 = ptVar8, lVar13 != 3; lVar13 = lVar13 + 1) {
              if ((char)ptVar8->firstnumber == '\0') {
                printf("Syntax error reading vertex coords on line");
                pcVar16 = " %d in file %s\n";
                goto LAB_0011181e;
              }
              dVar2 = strtod((char *)ptVar8,(char **)&local_e68);
              *(double *)((long)pdVar7 + lVar13 * 8 + lVar10) = dVar2;
              ptVar6 = ptVar8;
              ptVar8 = (tetgenio *)findnextnumber(ptVar8,(char *)local_e68);
            }
            uVar14 = (ulong)(uint)nverts;
            lVar10 = local_e60 + 0x18;
            lVar17 = local_e38 + 1;
          }
        }
      }
    }
    iVar3 = bcmp(id,"POLYGONS",9);
    if (iVar3 != 0) {
      iVar3 = bcmp(id,"LINES",6);
      pFVar5 = local_e48;
      if (iVar3 != 0) goto code_r0x00111188;
      goto LAB_001111a7;
    }
    __isoc99_sscanf(line,"%s %d  %d",id,&nfaces,&dummy);
    ptVar6 = local_e50;
    uVar14 = (ulong)nfaces;
    if (0 < (long)uVar14) {
      local_e50->numberoffacets = nfaces;
      pfVar9 = (facet *)operator_new__(uVar14 << 5);
      ptVar6->facetlist = pfVar9;
    }
    iVar3 = bcmp(mode,"BINARY",7);
    if (iVar3 == 0) {
      iVar3 = -1;
      lVar17 = 0;
      goto LAB_00111553;
    }
    ptVar8 = (tetgenio *)mode;
    iVar3 = bcmp(ptVar8,"ASCII",6);
    if (iVar3 != 0) goto LAB_00111530;
    iVar3 = -1;
    lVar17 = 0;
    goto LAB_001116c9;
  }
  pcVar16 = "Error:  No filename.";
LAB_0011146c:
  puts(pcVar16);
  return false;
LAB_00111553:
  pFVar5 = local_e48;
  if ((int)uVar14 <= lVar17) goto LAB_00111530;
  fread(&local_e2c,4,1,local_e48);
  swapBytes((uchar *)&local_e2c,4);
  if (iVar3 != local_e2c && lVar17 != 0) goto LAB_0011183a;
  if (local_e2c != 3) {
    pcVar16 = "Error: Only triangles are supported";
    goto LAB_0011146c;
  }
  local_e60 = lVar17;
  fread(&local_e20,4,1,pFVar5);
  fread(&local_e24,4,1,pFVar5);
  fread(&local_e28,4,1,pFVar5);
  swapBytes((uchar *)&local_e20,4);
  swapBytes((uchar *)&local_e24,4);
  swapBytes((uchar *)&local_e28,4);
  lVar10 = local_e60;
  pfVar9 = local_e50->facetlist;
  pfVar9[local_e60].polygonlist = (polygon *)0x0;
  pfVar9[local_e60].holelist = (double *)0x0;
  pfVar9[local_e60].numberofholes = 0;
  pfVar9[local_e60].numberofpolygons = 1;
  ppVar11 = (polygon *)operator_new__(0x10);
  pfVar9[lVar10].polygonlist = ppVar11;
  ppVar11->vertexlist = (int *)0x0;
  ppVar11->numberofvertices = 3;
  piVar12 = (int *)operator_new__(0xc);
  ppVar11->vertexlist = piVar12;
  *piVar12 = local_e20;
  piVar12[1] = local_e24;
  piVar12[2] = local_e28;
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    if (piVar12[lVar10] < (int)uVar15) {
      uVar15 = piVar12[lVar10];
    }
  }
  lVar17 = lVar17 + 1;
  uVar14 = (ulong)(uint)nfaces;
  iVar3 = 3;
  ptVar6 = local_e50;
  goto LAB_00111553;
LAB_001116c9:
  ptVar6 = local_e50;
  if ((int)uVar14 <= lVar17) {
LAB_00111530:
    fclose(local_e48);
    if (uVar15 < 2) {
      ptVar6->firstnumber = uVar15;
      return true;
    }
    printf("A wrong smallest index (%d) was detected in file %s\n",(ulong)uVar15,infilename);
    return false;
  }
  ptVar6 = (tetgenio *)readline(ptVar8,line,(FILE *)local_e48,&line_count);
  local_e68 = ptVar6;
  lVar10 = strtol((char *)ptVar6,(char **)&local_e68,0);
  if ((lVar17 != 0) && (iVar3 != (int)lVar10)) goto LAB_0011183a;
  if ((int)lVar10 != 3) {
    pcVar16 = "Error:  Only triangles are supported.";
    goto LAB_0011146c;
  }
  ptVar6 = (tetgenio *)findnextnumber(ptVar6,(char *)local_e68);
  local_e68 = ptVar6;
  local_e60 = strtol((char *)ptVar6,(char **)&local_e68,0);
  ptVar6 = (tetgenio *)findnextnumber(ptVar6,(char *)local_e68);
  local_e68 = ptVar6;
  local_e38 = strtol((char *)ptVar6,(char **)&local_e68,0);
  local_e68 = (tetgenio *)findnextnumber(ptVar6,(char *)local_e68);
  local_e10 = (uchar *)strtol((char *)local_e68,(char **)&local_e68,0);
  pfVar9 = local_e50->facetlist;
  pfVar9[lVar17].polygonlist = (polygon *)0x0;
  pfVar9[lVar17].holelist = (double *)0x0;
  pfVar9[lVar17].numberofholes = 0;
  pfVar9[lVar17].numberofpolygons = 1;
  ppVar11 = (polygon *)operator_new__(0x10);
  pfVar9[lVar17].polygonlist = ppVar11;
  ppVar11->vertexlist = (int *)0x0;
  ppVar11->numberofvertices = 3;
  ptVar8 = (tetgenio *)0xc;
  piVar12 = (int *)operator_new__(0xc);
  ppVar11->vertexlist = piVar12;
  *piVar12 = (int)local_e60;
  piVar12[1] = (int)local_e38;
  piVar12[2] = (int)local_e10;
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    if (piVar12[lVar10] < (int)uVar15) {
      uVar15 = piVar12[lVar10];
    }
  }
  lVar17 = lVar17 + 1;
  uVar14 = (ulong)(uint)nfaces;
  iVar3 = 3;
  goto LAB_001116c9;
LAB_0011183a:
  pcVar16 = "Error:  No mixed cells are allowed.";
  goto LAB_0011146c;
code_r0x00111188:
  pcVar16 = id;
  iVar3 = bcmp(pcVar16,"CELLS",6);
  if (iVar3 == 0) {
LAB_001111a7:
    pcVar16 = "Warning:  load_vtk(): cannot read formats LINES, CELLS.";
    puts("Warning:  load_vtk(): cannot read formats LINES, CELLS.");
  }
  goto LAB_001110af;
}

Assistant:

bool tetgenio::load_vtk(char* filebasename)
{
  FILE *fp;
  tetgenio::facet *f;
  tetgenio::polygon *p;
  char infilename[FILENAMESIZE];
  char line[INPUTLINESIZE];
  char mode[128], id[256], fmt[64];
  char *bufferp;
  double *coord;
  float _x, _y, _z;
  int nverts = 0;
  int nfaces = 0;
  int line_count = 0;
  int dummy;
  int id1, id2, id3;
  int nn = -1;
  int nn_old = -1;
  int i, j;
  bool ImALittleEndian = !testIsBigEndian();

  int smallestidx = 0;

  strncpy(infilename, filebasename, FILENAMESIZE - 1);
  infilename[FILENAMESIZE - 1] = '\0';
  if (infilename[0] == '\0') {
    printf("Error:  No filename.\n");
    return false;
  }
  if (strcmp(&infilename[strlen(infilename) - 4], ".vtk") != 0) {
    strcat(infilename, ".vtk");
  }
  if (!(fp = fopen(infilename, "r"))) {
    printf("Error:  Unable to open file %s\n", infilename);
    return false;
  }
  printf("Opening %s.\n", infilename);

  // Default uses the index starts from '0'.
  firstnumber = 0;
  strcpy(mode, "BINARY");

  while((bufferp = readline(line, fp, &line_count)) != NULL) {
    if(strlen(line) == 0) continue;
    //swallow lines beginning with a comment sign or white space
    if(line[0] == '#' || line[0]=='\n' || line[0] == 10 || line[0] == 13 || 
       line[0] == 32) continue;

    sscanf(line, "%s", id);
    if(!strcmp(id, "ASCII")) {
      strcpy(mode, "ASCII");
    }

    if(!strcmp(id, "POINTS")) {
      sscanf(line, "%s %d %s", id, &nverts, fmt);
      if (nverts > 0) {
        numberofpoints = nverts;
        pointlist = new REAL[nverts * 3];
        smallestidx = nverts + 1;
      }

      if(!strcmp(mode, "BINARY")) {
        for(i = 0; i < nverts; i++) {
          coord = &pointlist[i * 3];
          if(!strcmp(fmt, "double")) {
            fread((char*)(&(coord[0])), sizeof(double), 1, fp);
            fread((char*)(&(coord[1])), sizeof(double), 1, fp);
            fread((char*)(&(coord[2])), sizeof(double), 1, fp);
            if(ImALittleEndian){
              swapBytes((unsigned char *) &(coord[0]), sizeof(coord[0]));
              swapBytes((unsigned char *) &(coord[1]), sizeof(coord[1]));
              swapBytes((unsigned char *) &(coord[2]), sizeof(coord[2]));
            }
          } else if(!strcmp(fmt, "float")) {
            fread((char*)(&_x), sizeof(float), 1, fp);
            fread((char*)(&_y), sizeof(float), 1, fp);
            fread((char*)(&_z), sizeof(float), 1, fp);
            if(ImALittleEndian){
              swapBytes((unsigned char *) &_x, sizeof(_x));
              swapBytes((unsigned char *) &_y, sizeof(_y));
              swapBytes((unsigned char *) &_z, sizeof(_z));
            }
            coord[0] = double(_x);
            coord[1] = double(_y);
            coord[2] = double(_z);
          } else {
            printf("Error: Only float or double formats are supported!\n");
            return false;
          }
        }
      } else if(!strcmp(mode, "ASCII")) {
        for(i = 0; i < nverts; i++){
          bufferp = readline(line, fp, &line_count);
          if (bufferp == NULL) {
            printf("Unexpected end of file on line %d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          // Read vertex coordinates
          coord = &pointlist[i * 3];
          for (j = 0; j < 3; j++) {
            if (*bufferp == '\0') {
              printf("Syntax error reading vertex coords on line");
              printf(" %d in file %s\n", line_count, infilename);
              fclose(fp);
              return false;
            }
            coord[j] = (REAL) strtod(bufferp, &bufferp);
            bufferp = findnextnumber(bufferp);
          }
        }
      }
      continue;
    }

    if(!strcmp(id, "POLYGONS")) {
      sscanf(line, "%s %d  %d", id, &nfaces, &dummy);
      if (nfaces > 0) {
        numberoffacets = nfaces;
        facetlist = new tetgenio::facet[nfaces];
      }

      if(!strcmp(mode, "BINARY")) {
        for(i = 0; i < nfaces; i++){
          fread((char*)(&nn), sizeof(int), 1, fp);
          if(ImALittleEndian){
            swapBytes((unsigned char *) &nn, sizeof(nn));
          }
          if (i == 0)
            nn_old = nn;
          if (nn != nn_old) {
            printf("Error:  No mixed cells are allowed.\n");
            return false;
          }

          if(nn == 3){
            fread((char*)(&id1), sizeof(int), 1, fp);
            fread((char*)(&id2), sizeof(int), 1, fp);
            fread((char*)(&id3), sizeof(int), 1, fp);
            if(ImALittleEndian){
              swapBytes((unsigned char *) &id1, sizeof(id1));
              swapBytes((unsigned char *) &id2, sizeof(id2));
              swapBytes((unsigned char *) &id3, sizeof(id3));
            }
            f = &facetlist[i];
            init(f);
            // In .off format, each facet has one polygon, no hole.
            f->numberofpolygons = 1;
            f->polygonlist = new tetgenio::polygon[1];
            p = &f->polygonlist[0];
            init(p);
            // Set number of vertices
            p->numberofvertices = 3;
            // Allocate memory for face vertices
            p->vertexlist = new int[p->numberofvertices];
            p->vertexlist[0] = id1;
            p->vertexlist[1] = id2;
            p->vertexlist[2] = id3;
            // Detect the smallest index.
            for (j = 0; j < 3; j++) {
              if (p->vertexlist[j] < smallestidx) {
                smallestidx = p->vertexlist[j];
              }
            }
          } else {
            printf("Error: Only triangles are supported\n");
            return false;
          }
        }
      } else if(!strcmp(mode, "ASCII")) {
        for(i = 0; i < nfaces; i++) {
          bufferp = readline(line, fp, &line_count);
          nn = (int) strtol(bufferp, &bufferp, 0);
          if (i == 0)
            nn_old = nn;
          if (nn != nn_old) {
            printf("Error:  No mixed cells are allowed.\n");
            return false;
          }

          if (nn == 3) {
            bufferp = findnextnumber(bufferp); // Skip the first field.
            id1 = (int) strtol(bufferp, &bufferp, 0);
            bufferp = findnextnumber(bufferp);
            id2 = (int) strtol(bufferp, &bufferp, 0);
            bufferp = findnextnumber(bufferp);
            id3 = (int) strtol(bufferp, &bufferp, 0);
            f = &facetlist[i];
            init(f);
            // In .off format, each facet has one polygon, no hole.
            f->numberofpolygons = 1;
            f->polygonlist = new tetgenio::polygon[1];
            p = &f->polygonlist[0];
            init(p);
            // Set number of vertices
            p->numberofvertices = 3;
            // Allocate memory for face vertices
            p->vertexlist = new int[p->numberofvertices];
            p->vertexlist[0] = id1;
            p->vertexlist[1] = id2;
            p->vertexlist[2] = id3;
            // Detect the smallest index.
            for (j = 0; j < 3; j++) {
              if (p->vertexlist[j] < smallestidx) {
                smallestidx = p->vertexlist[j];
              }
            }
          } else {
            printf("Error:  Only triangles are supported.\n");
            return false;
          }
        }
      }

      fclose(fp);

      // Decide the firstnumber of the index.
      if (smallestidx == 0) {
        firstnumber = 0;  
      } else if (smallestidx == 1) {
        firstnumber = 1;
      } else {
        printf("A wrong smallest index (%d) was detected in file %s\n",
               smallestidx, infilename);
        return false;
      }

      return true;
    }

    if(!strcmp(id,"LINES") || !strcmp(id,"CELLS")){
      printf("Warning:  load_vtk(): cannot read formats LINES, CELLS.\n");
    }
  } // while ()

  return true;
}